

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O0

void __thiscall QDirListingPrivate::beginIterating(QDirListingPrivate *this)

{
  QDuplicateTracker<QString,_32UL> *in_stack_00000028;
  QDirEntryInfo *in_stack_00000038;
  QDirListingPrivate *in_stack_00000040;
  
  std::
  vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
  ::clear((vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
           *)0x293e63);
  std::
  vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
  ::clear((vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
           *)0x293e74);
  QDuplicateTracker<QString,_32UL>::clear(in_stack_00000028);
  pushDirectory(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void QDirListingPrivate::beginIterating()
{
#ifndef QT_NO_FILESYSTEMITERATOR
    nativeIterators.clear();
#endif
    fileEngineIterators.clear();
    visitedLinks.clear();
    pushDirectory(initialEntryInfo);
}